

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_15.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
read_numbers(vector<double,_std::allocator<double>_> *__return_storage_ptr__,string *fname)

{
  uint uVar1;
  istream *piVar2;
  double num;
  ifstream file;
  uint auStack_208 [122];
  
  std::ifstream::ifstream(&file,(string *)fname,_S_in);
  if ((*(byte *)((long)auStack_208 + *(long *)(_file + -0x18)) & 5) != 0) {
    file_open_err(fname,in);
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  num = 0.0;
  while( true ) {
    piVar2 = std::istream::_M_extract<double>((double *)&file);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&num);
  }
  uVar1 = *(uint *)((long)auStack_208 + *(long *)(_file + -0x18));
  if ((char)((uVar1 & 2) >> 1) == '\0' && (uVar1 & 5) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num,
                   "Failed to read data from file ",fname);
    error((string *)&num);
    std::__cxx11::string::~string((string *)&num);
  }
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> read_numbers(const std::string& fname)
{
	auto file = std::ifstream{ fname };
	if (!file)
	{
		file_open_err(fname, FileType::in);
	}
	auto numbers = std::vector<double>();
	for (auto num = 0.0; file >> num;)
	{
		numbers.push_back(num);
	}
	if ((file.bad() || file.fail()) && !file.eof())
	{
		error("Failed to read data from file " + fname);
	}
	return numbers;
}